

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::EmitNon32BitOvfCheck(Instr *instr,Instr *insertInstr,LabelInstr *bailOutLabel)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  RegOpnd *dstOpnd;
  Instr *pIVar5;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *pIVar6;
  
  if (instr->m_opcode != IMUL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c01,"(instr->m_opcode == Js::OpCode::IMUL)",
                       "IMUL should be used to check for non-32 bit overflow check on x86.");
    if (!bVar2) goto LAB_005dec41;
    *puVar4 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
  dstOpnd->m_reg = RegArg2;
  pIVar5 = IR::Instr::New(NOP,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,instr->m_func);
  bVar3 = instr->ignoreOverflowBitCount;
  if (bVar3 < 0x21) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1c0f,"(instr->ignoreOverflowBitCount > 32)",
                       "instr->ignoreOverflowBitCount > 32");
    if (!bVar2) {
LAB_005dec41:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar3 = instr->ignoreOverflowBitCount;
  }
  pIVar5 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar6 = IR::IntConstOpnd::New((ulong)(byte)(0x40 - bVar3),TyInt8,instr->m_func,true);
  pIVar5 = IR::Instr::New(SHL,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar6->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar6 = IR::IntConstOpnd::New((ulong)(byte)(0x40 - bVar3),TyInt8,instr->m_func,true);
  pIVar5 = IR::Instr::New(SAR,&dstOpnd_00->super_Opnd,&dstOpnd_00->super_Opnd,&pIVar6->super_Opnd,
                          instr->m_func);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  pIVar5 = IR::Instr::New(CMP,instr->m_func);
  IR::Instr::SetSrc1(pIVar5,&dstOpnd_00->super_Opnd);
  IR::Instr::SetSrc2(pIVar5,&dstOpnd->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,pIVar5);
  Lowerer::InsertBranch(JNE,false,bailOutLabel,insertInstr);
  return;
}

Assistant:

void
LowererMD::EmitNon32BitOvfCheck(IR::Instr *instr, IR::Instr *insertInstr, IR::LabelInstr* bailOutLabel)
{
    AssertMsg(instr->m_opcode == Js::OpCode::IMUL, "IMUL should be used to check for non-32 bit overflow check on x86.");

    IR::RegOpnd *edxSym = IR::RegOpnd::New(TyInt32, instr->m_func);
#ifdef _M_IX86
    edxSym->SetReg(RegEDX);
#else
    edxSym->SetReg(RegRDX);
#endif

    // dummy def for edx to force RegAlloc to generate a lifetime. This is removed later by the Peeps phase.
    IR::Instr *newInstr = IR::Instr::New(Js::OpCode::NOP, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    IR::RegOpnd *temp = IR::RegOpnd::New(TyInt32, instr->m_func);
    Assert(instr->ignoreOverflowBitCount > 32);
    uint8 shamt = 64 - instr->ignoreOverflowBitCount;

    // MOV temp, edx
    newInstr = IR::Instr::New(Js::OpCode::MOV, temp, edxSym, instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SHL temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SHL, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // SAR temp, shamt
    newInstr = IR::Instr::New(Js::OpCode::SAR, temp, temp, IR::IntConstOpnd::New(shamt, TyInt8, instr->m_func, true), instr->m_func);
    insertInstr->InsertBefore(newInstr);

    // CMP temp, edx
    newInstr = IR::Instr::New(Js::OpCode::CMP, instr->m_func);
    newInstr->SetSrc1(temp);
    newInstr->SetSrc2(edxSym);
    insertInstr->InsertBefore(newInstr);

    // JNE
    Lowerer::InsertBranch(Js::OpCode::JNE, false, bailOutLabel, insertInstr);
}